

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solid.cpp
# Opt level: O3

ssize_t __thiscall MeshLib::Solid::read(Solid *this,int __fd,void *__buf,size_t __nbytes)

{
  Solid *pSVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  long *plVar6;
  size_t sVar7;
  tVertex pVVar8;
  tFace pFVar9;
  double *pdVar10;
  tEdge pEVar11;
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  long *plVar12;
  long lVar13;
  string *this_00;
  int i_1;
  HalfEdge *pHVar14;
  int i;
  string_token_iterator iter;
  string s;
  string str;
  Point p;
  char line [2048];
  string_token_iterator local_8e8;
  Solid *local_8c8;
  undefined1 *local_8c0 [2];
  undefined1 local_8b0 [16];
  double local_8a0;
  string local_898;
  char *local_878 [2];
  char local_868 [16];
  Point local_858;
  long *local_840;
  char local_838 [2056];
  
  plVar12 = (long *)CONCAT44(in_register_00000034,__fd);
  local_8c8 = this;
  if ((*(byte *)((long)plVar12 + *(long *)(*plVar12 + -0x18) + 0x20) & 7) == 0) {
    lVar13 = *(long *)(*plVar12 + -0x18) + (long)plVar12;
    local_840 = plVar12;
    do {
      std::ios::widen((char)lVar13);
      plVar6 = (long *)std::istream::getline((char *)plVar12,(long)local_838,'\0');
      if ((*(byte *)((long)plVar6 + *(long *)(*plVar6 + -0x18) + 0x20) & 5) != 0) break;
      if (local_838[0] != '\0') {
        local_898._M_dataplus._M_p = (pointer)&local_898.field_2;
        sVar7 = strlen(local_838);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_898,local_838,local_838 + sVar7);
        local_8e8.separator = " \n";
        local_8e8.end = 0;
        local_8e8.str = &local_898;
        string_token_iterator::find_next(&local_8e8);
        std::__cxx11::string::string
                  ((string *)local_878,(string *)local_8e8.str,local_8e8.start,
                   local_8e8.end - local_8e8.start);
        iVar2 = std::__cxx11::string::compare((char *)local_878);
        if (iVar2 == 0) {
          string_token_iterator::find_next(&local_8e8);
          std::__cxx11::string::string
                    ((string *)local_8c0,(string *)local_8e8.str,local_8e8.start,
                     local_8e8.end - local_8e8.start);
          std::__cxx11::string::operator=((string *)local_878,(string *)local_8c0);
          if (local_8c0[0] != local_8b0) {
            operator_delete(local_8c0[0]);
          }
          iVar2 = atoi(local_878[0]);
          local_858.v[0] = 0.0;
          local_858.v[1] = 0.0;
          local_858.v[2] = 0.0;
          iVar3 = 0;
          do {
            string_token_iterator::find_next(&local_8e8);
            std::__cxx11::string::string
                      ((string *)local_8c0,(string *)local_8e8.str,local_8e8.start,
                       local_8e8.end - local_8e8.start);
            std::__cxx11::string::operator=((string *)local_878,(string *)local_8c0);
            if (local_8c0[0] != local_8b0) {
              operator_delete(local_8c0[0]);
            }
            local_8a0 = atof(local_878[0]);
            pdVar10 = Point::operator[](&local_858,iVar3);
            *pdVar10 = local_8a0;
            iVar3 = iVar3 + 1;
          } while (iVar3 != 3);
          pVVar8 = createVertex(local_8c8,iVar2);
          (pVVar8->m_point).v[2] = local_858.v[2];
          (pVVar8->m_point).v[0] = local_858.v[0];
          (pVVar8->m_point).v[1] = local_858.v[1];
          pVVar8->m_id = iVar2;
          uVar4 = std::__cxx11::string::find((char *)&local_898,0x1146b8,0);
          uVar5 = std::__cxx11::string::find((char *)&local_898,0x11470e,0);
          if (-1 < (int)(uVar5 | uVar4)) {
            std::__cxx11::string::substr((ulong)local_8c0,(ulong)&local_898);
            this_00 = (string *)&pVVar8->m_string;
LAB_0010f76c:
            std::__cxx11::string::operator=(this_00,(string *)local_8c0);
            if (local_8c0[0] != local_8b0) {
              operator_delete(local_8c0[0]);
            }
          }
        }
        else {
          iVar2 = std::__cxx11::string::compare((char *)local_878);
          if (iVar2 == 0) {
            string_token_iterator::find_next(&local_8e8);
            std::__cxx11::string::string
                      ((string *)local_8c0,(string *)local_8e8.str,local_8e8.start,
                       local_8e8.end - local_8e8.start);
            std::__cxx11::string::operator=((string *)local_878,(string *)local_8c0);
            if (local_8c0[0] != local_8b0) {
              operator_delete(local_8c0[0]);
            }
            iVar2 = atoi(local_878[0]);
            lVar13 = 0;
            do {
              string_token_iterator::find_next(&local_8e8);
              std::__cxx11::string::string
                        ((string *)local_8c0,(string *)local_8e8.str,local_8e8.start,
                         local_8e8.end - local_8e8.start);
              std::__cxx11::string::operator=((string *)local_878,(string *)local_8c0);
              if (local_8c0[0] != local_8b0) {
                operator_delete(local_8c0[0]);
              }
              iVar3 = atoi(local_878[0]);
              *(int *)((long)local_858.v + lVar13 * 4) = iVar3;
              lVar13 = lVar13 + 1;
            } while (lVar13 != 3);
            pFVar9 = createFace(local_8c8,(int *)&local_858,iVar2);
            uVar4 = std::__cxx11::string::find((char *)&local_898,0x1146b8,0);
            uVar5 = std::__cxx11::string::find((char *)&local_898,0x11470e,0);
            if (-1 < (int)(uVar5 | uVar4)) {
              std::__cxx11::string::substr((ulong)local_8c0,(ulong)&local_898);
              this_00 = (string *)&pFVar9->m_string;
              goto LAB_0010f76c;
            }
          }
          else {
            iVar2 = std::__cxx11::string::compare((char *)local_878);
            if (iVar2 == 0) {
              string_token_iterator::find_next(&local_8e8);
              std::__cxx11::string::string
                        ((string *)local_8c0,(string *)local_8e8.str,local_8e8.start,
                         local_8e8.end - local_8e8.start);
              std::__cxx11::string::operator=((string *)local_878,(string *)local_8c0);
              if (local_8c0[0] != local_8b0) {
                operator_delete(local_8c0[0]);
              }
              iVar2 = atoi(local_878[0]);
              string_token_iterator::find_next(&local_8e8);
              std::__cxx11::string::string
                        ((string *)local_8c0,(string *)local_8e8.str,local_8e8.start,
                         local_8e8.end - local_8e8.start);
              std::__cxx11::string::operator=((string *)local_878,(string *)local_8c0);
              if (local_8c0[0] != local_8b0) {
                operator_delete(local_8c0[0]);
              }
              iVar3 = atoi(local_878[0]);
              pEVar11 = idEdge(local_8c8,iVar2,iVar3);
              string_token_iterator::find_next(&local_8e8);
              std::__cxx11::string::string
                        ((string *)local_8c0,(string *)local_8e8.str,local_8e8.start,
                         local_8e8.end - local_8e8.start);
              std::__cxx11::string::operator=((string *)local_878,(string *)local_8c0);
              if (local_8c0[0] != local_8b0) {
                operator_delete(local_8c0[0]);
              }
              uVar4 = std::__cxx11::string::find((char *)&local_898,0x1146b8,0);
              uVar5 = std::__cxx11::string::find((char *)&local_898,0x11470e,0);
              if (-1 < (int)(uVar5 | uVar4)) {
                std::__cxx11::string::substr((ulong)local_8c0,(ulong)&local_898);
                this_00 = (string *)&pEVar11->m_string;
                goto LAB_0010f76c;
              }
            }
            else {
              iVar2 = std::__cxx11::string::compare((char *)local_878);
              if (iVar2 == 0) {
                string_token_iterator::find_next(&local_8e8);
                std::__cxx11::string::string
                          ((string *)local_8c0,(string *)local_8e8.str,local_8e8.start,
                           local_8e8.end - local_8e8.start);
                std::__cxx11::string::operator=((string *)local_878,(string *)local_8c0);
                if (local_8c0[0] != local_8b0) {
                  operator_delete(local_8c0[0]);
                }
                iVar2 = atoi(local_878[0]);
                string_token_iterator::find_next(&local_8e8);
                std::__cxx11::string::string
                          ((string *)local_8c0,(string *)local_8e8.str,local_8e8.start,
                           local_8e8.end - local_8e8.start);
                std::__cxx11::string::operator=((string *)local_878,(string *)local_8c0);
                if (local_8c0[0] != local_8b0) {
                  operator_delete(local_8c0[0]);
                }
                iVar3 = atoi(local_878[0]);
                pSVar1 = local_8c8;
                local_8a0 = (double)CONCAT44(local_8a0._4_4_,iVar3);
                pVVar8 = idVertex(local_8c8,iVar2);
                pFVar9 = idFace(pSVar1,local_8a0._0_4_);
                pHVar14 = pFVar9->m_halfedge;
                do {
                  if (pHVar14->m_vertex == pVVar8) goto LAB_0010f2ff;
                  pHVar14 = pHVar14->m_next;
                } while (pHVar14 != pFVar9->m_halfedge);
                pHVar14 = (HalfEdge *)0x0;
LAB_0010f2ff:
                string_token_iterator::find_next(&local_8e8);
                std::__cxx11::string::string
                          ((string *)local_8c0,(string *)local_8e8.str,local_8e8.start,
                           local_8e8.end - local_8e8.start);
                std::__cxx11::string::operator=((string *)local_878,(string *)local_8c0);
                if (local_8c0[0] != local_8b0) {
                  operator_delete(local_8c0[0]);
                }
                uVar4 = std::__cxx11::string::find((char *)&local_898,0x1146b8,0);
                uVar5 = std::__cxx11::string::find((char *)&local_898,0x11470e,0);
                if (-1 < (int)(uVar5 | uVar4)) {
                  std::__cxx11::string::substr((ulong)local_8c0,(ulong)&local_898);
                  this_00 = (string *)&pHVar14->m_string;
                  goto LAB_0010f76c;
                }
              }
            }
          }
        }
        if (local_878[0] != local_868) {
          operator_delete(local_878[0]);
        }
        plVar12 = local_840;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_898._M_dataplus._M_p != &local_898.field_2) {
          operator_delete(local_898._M_dataplus._M_p);
        }
      }
      lVar13 = (long)plVar12 + *(long *)(*plVar12 + -0x18);
    } while ((*(byte *)((long)plVar12 + *(long *)(*plVar12 + -0x18) + 0x20) & 7) == 0);
  }
  pSVar1 = local_8c8;
  labelBoundaryEdges(local_8c8);
  removeDanglingVertices(pSVar1);
  return extraout_RAX;
}

Assistant:

void Solid::read( std::istream & is ) {
	char line[MAX_LINE];
	int id;

	while( is && !is.eof() && is.getline(line, MAX_LINE) )
	{		
		if( strlen( line ) == 0 ) continue;

		std::string s(line);

		string_token_iterator iter(s, " \n"); 
		
		std::string str = *iter;

		if( str == "Vertex" ) 
		{
			
			str = *(++iter);

			id = atoi( str.c_str() );


			Point p;
			for( int i = 0 ; i < 3; i ++ )
			{
				str = *(++iter);
				p[i] = atof( str.c_str() );
			}
		
			tVertex v  = createVertex( id );
			
			v->point() = p;
			v->id()    = id;

			int sp = (int)s.find("{");
			int ep = (int)s.find("}");

			if( sp >= 0 && ep >= 0 )
			{
				v->string() = s.substr( sp+1, ep-sp-1 );
			}

			continue;

		}

		if( str == "Face" ) {
			str = *(++iter);

			id = atoi( str.c_str() );
	
			int v[3];
			for( int i = 0; i < 3; i ++ ) {
				str = *(++iter);
				v[i] = atoi( str.c_str() );
			}

			tFace f = createFace( v, id );
			

			int sp = (int)s.find("{");
			int ep = (int)s.find("}");

			if( sp >= 0 && ep >= 0 )
			{
				f->string() = s.substr( sp+1, ep-sp-1 );
			}
			continue;
		}

		//read in edge attributes
		if( str == "Edge" )
		{
			str = *(++iter);
			int id0 = atoi( str.c_str() );

			str = *(++iter);
			int id1 = atoi( str.c_str() );

			tEdge edge = idEdge( id0, id1 );
			
			str = *(++iter);

			int sp = (int)s.find("{");
			int ep = (int)s.find("}");

			if( sp >= 0 && ep >= 0 )
			{
				edge->string() = s.substr( sp+1, ep-sp-1 );
			}
			
			continue;

		}

		//read in edge attributes
		if( str == "Corner" ) 
		{
			str = *(++iter);
			int id0 = atoi( str.c_str() );
				
			str = *(++iter);
			int id1 = atoi( str.c_str() );


			Vertex * v = idVertex( id0 );
			Face   * f = idFace( id1 );
			tHalfEdge he = corner( v, f );

			str = *(++iter);

			int sp = (int)s.find("{");
			int ep = (int)s.find("}");

			if( sp >= 0 && ep >= 0 )
			{
				he->string() = s.substr( sp+1, ep-sp-1 );
			}
			continue;
		}


	}

	labelBoundaryEdges();

	removeDanglingVertices();

}